

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

void __thiscall correctness_xor_signed_Test::TestBody(correctness_xor_signed_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  big_integer b;
  big_integer a;
  internal local_1d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  long *local_1c8 [7];
  undefined1 local_190 [56];
  big_integer local_158;
  big_integer local_120;
  big_integer local_e8;
  big_integer local_b0;
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_40,0xaa);
  big_integer::big_integer(&local_78,0xcc);
  big_integer::big_integer(&local_b0,&local_40);
  big_integer::big_integer(&local_e8,&local_78);
  big_integer::big_integer(&local_158,0x100);
  operator-((big_integer *)local_1c8,&local_e8,&local_158);
  operator^((big_integer *)local_190,&local_b0,(big_integer *)local_1c8);
  big_integer::big_integer(&local_120,-0x9a);
  local_1d8[0] = (internal)operator==((big_integer *)local_190,&local_120);
  local_1d0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  big_integer::~big_integer(&local_120);
  big_integer::~big_integer((big_integer *)local_190);
  big_integer::~big_integer((big_integer *)local_1c8);
  big_integer::~big_integer(&local_158);
  big_integer::~big_integer(&local_e8);
  big_integer::~big_integer(&local_b0);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_190,local_1d8,(AssertionResult *)"(a ^ (b - 256)) == (0x66 - 256)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x180,(char *)local_190._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_158,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8[0] !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_1c8[0] + 8))();
      }
      local_1c8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  big_integer::~big_integer(&local_40);
  return;
}

Assistant:

TEST(correctness, xor_signed)
{
    big_integer a = 0xaa;
    big_integer b = 0xcc;

    EXPECT_TRUE((a ^ (b - 256)) == (0x66 - 256));
}